

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O2

void __thiscall
UnixMakefileGenerator::writeSubTargets
          (UnixMakefileGenerator *this,QTextStream *t,QList<MakefileGenerator::SubTarget_*> targets,
          int flags)

{
  long lVar1;
  QMakeProject *this_00;
  QList<MakefileGenerator::SubTarget_*> targets_00;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  char cVar5;
  QTextStream *pQVar6;
  QTextStream *this_01;
  undefined4 in_register_00000014;
  long *plVar7;
  int target;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffe28;
  QTextStream *this_02;
  qsizetype in_stack_fffffffffffffe38;
  UnixMakefileGenerator *pUVar9;
  QArrayDataPointer<char16_t> local_1b0;
  QArrayDataPointer<char16_t> local_198;
  QStringBuilder<const_char_(&)[8],_QString> local_178;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
  local_158;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]> local_98;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<MakefileGenerator::SubTarget_*> local_50;
  long local_38;
  
  plVar7 = (long *)CONCAT44(in_register_00000014,flags);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (Data *)*plVar7;
  local_50.ptr = (SubTarget **)plVar7[1];
  local_50.size = plVar7[2];
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  targets_00.d.ptr = (SubTarget **)t;
  targets_00.d.d = (Data *)in_stack_fffffffffffffe28;
  targets_00.d.size = in_stack_fffffffffffffe38;
  this_02 = t;
  MakefileGenerator::writeSubTargets(&this->super_MakefileGenerator,t,targets_00,(int)&local_50);
  QArrayDataPointer<MakefileGenerator::SubTarget_*>::~QArrayDataPointer(&local_50);
  pQVar6 = (QTextStream *)QTextStream::operator<<(t,"dist: distdir FORCE");
  Qt::endl(pQVar6);
  QTextStream::operator<<
            (t,
             "\t(cd `dirname $(DISTDIR)` && $(TAR) $(DISTNAME).tar $(DISTNAME) && $(COMPRESS) $(DISTNAME).tar) && $(MOVE) `dirname $(DISTDIR)`/$(DISTNAME).tar.gz . && $(DEL_FILE) -r $(DISTDIR)"
            );
  pQVar6 = (QTextStream *)Qt::endl(t);
  Qt::endl(pQVar6);
  QTextStream::operator<<(t,"distdir:");
  for (uVar8 = 0; uVar8 < (ulong)plVar7[2]; uVar8 = uVar8 + 1) {
    lVar1 = *(long *)(plVar7[1] + uVar8 * 8);
    pQVar6 = (QTextStream *)QTextStream::operator<<(this_02," ");
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)(lVar1 + 0x60));
    QTextStream::operator<<(pQVar6,"-distdir");
  }
  pQVar6 = (QTextStream *)QTextStream::operator<<(this_02," FORCE\n\t");
  QString::QString((QString *)&local_178,"$(DISTDIR)");
  uVar8 = 0;
  MakefileGenerator::mkdir_p_asstring
            ((QString *)&local_98,&this->super_MakefileGenerator,(QString *)&local_178,false);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_98);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"\n\t");
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"$(COPY_FILE) --parents ");
  ProKey::ProKey((ProKey *)&local_158,"DISTFILES");
  MakefileGenerator::fileVar
            ((QString *)&local_68,&this->super_MakefileGenerator,(ProKey *)&local_158);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_68);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," $(DISTDIR)");
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&Option::dir_sep);
  pQVar6 = (QTextStream *)Qt::endl(pQVar6);
  Qt::endl(pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
  local_68.size = -0x5555555555555556;
  local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  this_00 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_ABSOLUTE_SOURCE_PATH");
  QMakeEvaluator::first((ProString *)&local_158,&this_00->super_QMakeEvaluator,(ProKey *)&local_98);
  ProString::toQString((QString *)&local_68,(ProString *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  while( true ) {
    if ((ulong)plVar7[2] <= uVar8) break;
    lVar1 = *(long *)(plVar7[1] + uVar8 * 8);
    local_b0.d = *(Data **)(lVar1 + 0x18);
    local_b0.ptr = *(char16_t **)(lVar1 + 0x20);
    local_b0.size = *(long *)(lVar1 + 0x28);
    if (local_b0.d != (Data *)0x0) {
      LOCK();
      ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar6 = this_02;
    pUVar9 = this;
    if (local_b0.size != 0) {
      cVar5 = QString::endsWith((QString *)&local_b0,0x26bbd0);
      pQVar6 = this_02;
      if (cVar5 == '\0') {
        QString::append((QString *)&local_b0);
        pQVar6 = this_02;
      }
    }
    local_c8.d = *(Data **)(lVar1 + 0x30);
    local_c8.ptr = *(char16_t **)(lVar1 + 0x38);
    local_c8.size = *(long *)(lVar1 + 0x40);
    if (local_c8.d != (Data *)0x0) {
      LOCK();
      ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((Data *)local_c8.size != (Data *)0x0) {
      cVar5 = QString::endsWith((QString *)&local_c8,0x26bbd0);
      if (cVar5 == '\0') {
        QString::append((QString *)&local_c8);
      }
    }
    if (local_68.size != 0) {
      cVar5 = QString::startsWith((QString *)&local_c8,(CaseSensitivity)&local_68);
      if (cVar5 != '\0') {
        QString::mid((longlong)&local_178,(longlong)&local_c8);
        local_158.a.a.b.d.size = (qsizetype)local_178.b.d.ptr;
        local_158.a.a.b.d.ptr = (char16_t *)local_178.b.d.d;
        local_158.a.a.b.d.d = (Data *)local_178.a;
        local_158.a.a.a = (char (*) [8])&Option::output_dir;
        local_178.a = (char (*) [8])0x0;
        local_178.b.d.d = (Data *)0x0;
        local_178.b.d.ptr = (char16_t *)0x0;
        QStringBuilder<QString_&,_QString>::convertTo<QString>
                  ((QString *)&local_98,(QStringBuilder<QString_&,_QString> *)&local_158);
        qVar4 = local_c8.size;
        pcVar3 = local_c8.ptr;
        pDVar2 = local_c8.d;
        local_c8.d = (Data *)local_98.a.a;
        local_c8.ptr = (char16_t *)local_98.a.b.d.d;
        local_98.a.a = (char (*) [8])pDVar2;
        local_98.a.b.d.d = (Data *)pcVar3;
        local_c8.size = (qsizetype)local_98.a.b.d.ptr;
        local_98.a.b.d.ptr = (char16_t *)qVar4;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158.a.a.b.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
      }
    }
    local_e0.d = local_c8.d;
    local_e0.ptr = local_c8.ptr;
    local_e0.size = local_c8.size;
    if (local_c8.d != (Data *)0x0) {
      LOCK();
      ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    cVar5 = QString::endsWith((QString *)&local_e0,0x26bbd0);
    if (cVar5 != '\0') {
      QString::chop((longlong)&local_e0);
    }
    cVar5 = QString::startsWith((QString *)&local_e0,0x26bbd0);
    if (cVar5 == '\0') {
      QString::prepend((QString *)&local_e0,&Option::dir_sep);
    }
    local_f8.size = -0x5555555555555556;
    local_f8.d._0_4_ = 0xaaaaaaaa;
    local_f8.d._4_4_ = 0xaaaaaaaa;
    local_f8.ptr._0_4_ = 0xaaaaaaaa;
    local_f8.ptr._4_4_ = 0xaaaaaaaa;
    if ((Data *)local_c8.size == (Data *)0x0) {
      QString::QString((QString *)&local_f8,"\n\t");
    }
    else {
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_178,this,&local_c8);
      local_98.a.b.d.size = (qsizetype)local_178.b.d.ptr;
      local_98.a.b.d.ptr = (char16_t *)local_178.b.d.d;
      local_98.a.b.d.d = (Data *)local_178.a;
      local_98.a.a = (char (*) [8])0x21b3de;
      local_178.a = (char (*) [8])0x0;
      local_178.b.d.d = (Data *)0x0;
      local_178.b.d.ptr = (char16_t *)0x0;
      QStringBuilder<const_char_(&)[6],_QString>::QStringBuilder
                ((QStringBuilder<const_char_(&)[6],_QString> *)&local_158,
                 (QStringBuilder<const_char_(&)[6],_QString> *)&local_98);
      local_158.a.b = (char (*) [28])0x21b37c;
      QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::
      convertTo<QString>((QString *)&local_f8,
                         (QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>
                          *)&local_158);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158.a.a.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98.a.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
    }
    local_118.size = -0x5555555555555556;
    local_118.d._0_4_ = 0xaaaaaaaa;
    local_118.d._4_4_ = 0xaaaaaaaa;
    local_118.ptr._0_4_ = 0xaaaaaaaa;
    local_118.ptr._4_4_ = 0xaaaaaaaa;
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
              (&local_198,this,lVar1 + 0x78);
    local_178.b.d.size = local_198.size;
    local_178.b.d.ptr = local_198.ptr;
    local_178.b.d.d = local_198.d;
    local_178.a = (char (*) [8])0x21c7bb;
    local_198.d = (Data *)0x0;
    local_198.ptr = (char16_t *)0x0;
    local_198.size = 0;
    QStringBuilder<const_char_(&)[8],_QString>::QStringBuilder(&local_98.a,&local_178);
    local_98.b = (char (*) [28])0x21c7c3;
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
              (&local_1b0,this,&local_e0);
    QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
    ::QStringBuilder(&local_158,&local_98,(QString *)&local_1b0);
    QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
    ::convertTo<QString>((QString *)&local_118,&local_158);
    QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
    ::~QStringBuilder(&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98.a.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
    local_158.a.a.a = *(char (**) [8])(lVar1 + 0x78);
    local_158.a.a.b.d.d = *(Data **)(lVar1 + 0x80);
    local_158.a.a.b.d.ptr = *(char16_t **)(lVar1 + 0x88);
    if ((QString *)local_158.a.a.a != (QString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_158.a.a.a)->d).d =
           *(int *)&(((QString *)local_158.a.a.a)->d).d + 1;
      UNLOCK();
    }
    local_98.a.b.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_98.a.a = (char (*) [8])0xaaaaaaaaaaaaaaaa;
    local_98.a.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_1b0.ptr = (char16_t *)(lVar1 + 0x48);
    local_1b0.d = (Data *)&local_b0;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)&local_198,(QStringBuilder<QString_&,_QString_&> *)&local_1b0);
    MakefileGenerator::fileFixify
              ((QString *)&local_178,&this->super_MakefileGenerator,(QString *)&local_198,
               (FileFixifyTypes)0x4,true);
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
              (&local_98,this,&local_178);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
    cVar5 = QString::startsWith((QString *)&local_158,(CaseSensitivity)&local_b0);
    if (cVar5 != '\0') {
      QString::remove((longlong)&local_158,0);
    }
    this_02 = pQVar6;
    this_01 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)(lVar1 + 0x60));
    QTextStream::operator<<(this_01,"-distdir: FORCE");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
              (&local_178,this,&local_158);
    MakefileGenerator::writeSubTargetCall
              (&this->super_MakefileGenerator,pQVar6,(QString *)&local_b0,(QString *)&local_98,
               (QString *)&local_c8,(QString *)&local_178,(QString *)&local_f8,(QString *)&local_118
              );
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
    Qt::endl(pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    uVar8 = uVar8 + 1;
    this = pUVar9;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
UnixMakefileGenerator::writeSubTargets(QTextStream &t, QList<MakefileGenerator::SubTarget*> targets, int flags)
{
    MakefileGenerator::writeSubTargets(t, targets, flags);

    t << "dist: distdir FORCE" << Qt::endl;
    t << "\t(cd `dirname $(DISTDIR)` && $(TAR) $(DISTNAME).tar $(DISTNAME) && $(COMPRESS) $(DISTNAME).tar)"
         " && $(MOVE) `dirname $(DISTDIR)`/$(DISTNAME).tar.gz . && $(DEL_FILE) -r $(DISTDIR)";
    t << Qt::endl << Qt::endl;

    t << "distdir:";
    for (int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        t << " " << subtarget->target << "-distdir";
    }
    t << " FORCE\n\t"
      << mkdir_p_asstring("$(DISTDIR)", false) << "\n\t"
      << "$(COPY_FILE) --parents " << fileVar("DISTFILES") << " $(DISTDIR)" << Option::dir_sep << Qt::endl << Qt::endl;

    const QString abs_source_path = project->first("QMAKE_ABSOLUTE_SOURCE_PATH").toQString();
    for (int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        QString in_directory = subtarget->in_directory;
        if (!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
            in_directory += Option::dir_sep;
        QString out_directory = subtarget->out_directory;
        if (!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
            out_directory += Option::dir_sep;
        if (!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
            out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

        QString dist_directory = out_directory;
        if (dist_directory.endsWith(Option::dir_sep))
            dist_directory.chop(Option::dir_sep.size());
        if (!dist_directory.startsWith(Option::dir_sep))
            dist_directory.prepend(Option::dir_sep);

        QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                             : "\n\tcd " + escapeFilePath(out_directory) + " && ";
        QString makefilein = " -e -f " + escapeFilePath(subtarget->makefile)
                + " distdir DISTDIR=$(DISTDIR)" + escapeFilePath(dist_directory);

        QString out = subtarget->makefile;
        QString in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
        if (out.startsWith(in_directory))
            out.remove(0, in_directory.size());

        t << subtarget->target << "-distdir: FORCE";
        writeSubTargetCall(t, in_directory, in, out_directory, escapeFilePath(out),
                           out_directory_cdin, makefilein);
        t << Qt::endl;
    }
}